

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ColourImpl *pCVar5;
  ulong uVar6;
  ConsoleReporter *pCVar7;
  ulong uVar8;
  ostream *poVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong *puVar12;
  size_t skippedRatio;
  size_t passedRatio;
  size_t failedButOkRatio;
  size_t failedRatio;
  long *local_a0;
  long local_98;
  long local_90 [2];
  ulong local_80 [4];
  ConsoleReporter *local_60;
  ColourImpl *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  uVar1 = (totals->testCases).passed;
  uVar2 = (totals->testCases).failed;
  uVar3 = (totals->testCases).failedButOk;
  uVar4 = (totals->testCases).skipped;
  uVar11 = uVar2 + uVar1 + uVar3 + uVar4;
  if (uVar11 == 0) {
    poVar9 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    (*pCVar5->_vptr_ColourImpl[2])(pCVar5,0x16);
    local_a0 = local_90;
    std::__cxx11::string::_M_construct((ulong)&local_a0,'O');
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_a0,local_98);
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    (*pCVar5->_vptr_ColourImpl[2])(pCVar5,0);
  }
  else {
    uVar8 = (uVar2 * 0x50) / uVar11;
    local_80[3] = uVar8;
    if (uVar2 * 0x50 < uVar11) {
      local_80[3] = 1;
    }
    if (uVar2 == 0) {
      local_80[3] = uVar8;
    }
    uVar8 = (uVar3 * 0x50) / uVar11;
    local_80[2] = uVar8;
    if (uVar3 * 0x50 < uVar11) {
      local_80[2] = 1;
    }
    if (uVar3 == 0) {
      local_80[2] = uVar8;
    }
    uVar8 = (uVar1 * 0x50) / uVar11;
    local_80[1] = uVar8;
    if (uVar1 * 0x50 < uVar11) {
      local_80[1] = 1;
    }
    if (uVar1 == 0) {
      local_80[1] = uVar8;
    }
    uVar8 = uVar4 * 0x50;
    puVar10 = (ulong *)(uVar8 % uVar11);
    local_80[0] = 1;
    if (uVar11 <= uVar8) {
      local_80[0] = uVar8 / uVar11;
    }
    if (uVar4 == 0) {
      local_80[0] = uVar8 / uVar11;
    }
    uVar11 = local_80[2] + local_80[3] + local_80[1];
    if (uVar11 + local_80[0] < 0x4f) {
      puVar10 = local_80 + 1;
      do {
        if ((((local_80[3] <= local_80[2]) || (local_80[3] <= local_80[1])) ||
            (puVar12 = local_80 + 3, local_80[3] <= local_80[0])) &&
           (((local_80[2] <= local_80[1] || (puVar12 = local_80 + 2, local_80[2] <= local_80[0])) &&
            (puVar12 = puVar10, local_80[1] <= local_80[0])))) {
          puVar12 = local_80;
        }
        *puVar12 = *puVar12 + 1;
        uVar11 = local_80[2] + local_80[3] + local_80[1];
      } while (uVar11 + local_80[0] < 0x4f);
    }
    if (0x4f < uVar11) {
      puVar10 = local_80 + 1;
      do {
        puVar12 = local_80 + 3;
        if ((((local_80[3] <= local_80[1] || local_80[3] <= local_80[2]) ||
              local_80[3] <= local_80[0]) &&
            (puVar12 = local_80 + 2, local_80[2] <= local_80[1] || local_80[2] <= local_80[0])) &&
           (puVar12 = puVar10, local_80[1] <= local_80[0])) {
          puVar12 = local_80;
        }
        *puVar12 = *puVar12 - 1;
      } while (0x4f < local_80[2] + local_80[3] + local_80[1]);
    }
    uVar6 = local_80[3];
    uVar8 = local_80[2];
    uVar11 = local_80[1];
    poVar9 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    local_58 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    (*local_58->_vptr_ColourImpl[2])(local_58,0x12,puVar10);
    local_a0 = local_90;
    std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar6);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_a0,local_98);
    pCVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    local_60 = this;
    (*pCVar5->_vptr_ColourImpl[2])(pCVar5,0x16);
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    (*pCVar5->_vptr_ColourImpl[2])(pCVar5,0);
    pCVar7 = local_60;
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    (*local_58->_vptr_ColourImpl[2])(local_58,0);
    poVar9 = (pCVar7->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar5 = (pCVar7->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    if ((((totals->testCases).failed == 0) && ((totals->testCases).failedButOk == 0)) &&
       ((totals->testCases).skipped == 0)) {
      (*pCVar5->_vptr_ColourImpl[2])(pCVar5,0x13);
      local_a0 = local_90;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_a0,local_98);
      this = local_60;
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      (*pCVar5->_vptr_ColourImpl[2])(pCVar5,0);
    }
    else {
      (*pCVar5->_vptr_ColourImpl[2])(pCVar5,3);
      local_a0 = local_90;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_a0,local_98);
      this = local_60;
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      (*pCVar5->_vptr_ColourImpl[2])(pCVar5,0);
    }
    poVar9 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    (*pCVar5->_vptr_ColourImpl[2])(pCVar5,0x17);
    local_a0 = local_90;
    std::__cxx11::string::_M_construct((ulong)&local_a0,(char)local_80[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_a0,local_98);
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    (*pCVar5->_vptr_ColourImpl[2])(pCVar5,0);
  }
  local_a0 = (long *)CONCAT71(local_a0._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,(char *)&local_a0,1);
  return;
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        std::size_t skippedRatio = makeRatio(totals.testCases.skipped, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio + skippedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)--;

        m_stream << m_colour->guardColour( Colour::Error )
                 << std::string( failedRatio, '=' )
                 << m_colour->guardColour( Colour::ResultExpectedFailure )
                 << std::string( failedButOkRatio, '=' );
        if ( totals.testCases.allPassed() ) {
            m_stream << m_colour->guardColour( Colour::ResultSuccess )
                     << std::string( passedRatio, '=' );
        } else {
            m_stream << m_colour->guardColour( Colour::Success )
                     << std::string( passedRatio, '=' );
        }
        m_stream << m_colour->guardColour( Colour::Skip )
                 << std::string( skippedRatio, '=' );
    } else {
        m_stream << m_colour->guardColour( Colour::Warning )
                 << std::string( CATCH_CONFIG_CONSOLE_WIDTH - 1, '=' );
    }
    m_stream << '\n';
}